

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O3

void __thiscall
syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_True_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_True_Test *this)

{
  return;
}

Assistant:

TEST(GTestSyntaxTest, True)
{
    if( bool b = true )
        ASSERT_TRUE(b) << b;
    if( bool b = true )
        EXPECT_TRUE(b) << b;
    if( bool b = true )
        INFORM_TRUE(b) << b;
    if( bool b = true )
        ASSUME_TRUE(b) << b;
}